

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_chart_add_slot_colored
               (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
               float min_value,float max_value)

{
  int iVar1;
  nk_panel *pnVar2;
  nk_chart *pnVar3;
  nk_chart_slot *pnVar4;
  float local_40;
  float local_3c;
  nk_chart_slot *slot;
  nk_chart *chart;
  float max_value_local;
  float min_value_local;
  int count_local;
  nk_chart_type type_local;
  nk_context *ctx_local;
  nk_color highlight_local;
  nk_color color_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x54f5,
                  "void nk_chart_add_slot_colored(struct nk_context *, const enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x54f6,
                  "void nk_chart_add_slot_colored(struct nk_context *, const enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x54f7,
                  "void nk_chart_add_slot_colored(struct nk_context *, const enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (3 < (ctx->current->layout->chart).slot) {
    __assert_fail("ctx->current->layout->chart.slot < 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x54f8,
                  "void nk_chart_add_slot_colored(struct nk_context *, const enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) && ((ctx->current->layout->chart).slot < 4)) {
    pnVar2 = ctx->current->layout;
    pnVar3 = &pnVar2->chart;
    iVar1 = pnVar3->slot;
    pnVar3->slot = iVar1 + 1;
    pnVar4 = (pnVar2->chart).slots + iVar1;
    pnVar4->type = type;
    pnVar4->count = count;
    pnVar4->color = color;
    pnVar4->highlight = highlight;
    local_3c = max_value;
    if (min_value < max_value) {
      local_3c = min_value;
    }
    pnVar4->min = local_3c;
    local_40 = min_value;
    if (min_value < max_value) {
      local_40 = max_value;
    }
    pnVar4->max = local_40;
    pnVar4->range = pnVar4->max - pnVar4->min;
  }
  return;
}

Assistant:

NK_API void
nk_chart_add_slot_colored(struct nk_context *ctx, const enum nk_chart_type type,
    struct nk_color color, struct nk_color highlight,
    int count, float min_value, float max_value)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    NK_ASSERT(ctx->current->layout->chart.slot < NK_CHART_MAX_SLOT);
    if (!ctx || !ctx->current || !ctx->current->layout) return;
    if (ctx->current->layout->chart.slot >= NK_CHART_MAX_SLOT) return;

    /* add another slot into the graph */
    {struct nk_chart *chart = &ctx->current->layout->chart;
    struct nk_chart_slot *slot = &chart->slots[chart->slot++];
    slot->type = type;
    slot->count = count;
    slot->color = color;
    slot->highlight = highlight;
    slot->min = NK_MIN(min_value, max_value);
    slot->max = NK_MAX(min_value, max_value);
    slot->range = slot->max - slot->min;}
}